

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * ResolveInitializerValue(ExpressionContext *ctx,SynBase *source,ExprBase *initializer)

{
  TypeFunction *type;
  FunctionData *function;
  ScopeData *pSVar1;
  ArrayView<FunctionValue> functions;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  ExprBase *arg1;
  FunctionData *this;
  FunctionData *pFVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TypeBase *type_00;
  size_t sVar6;
  char *pcVar7;
  char *dst;
  InplaceStr name;
  undefined4 uStack_344;
  FunctionValue bestOverload;
  undefined4 extraout_var_00;
  
  if (initializer == (ExprBase *)0x0) {
    pcVar7 = "ERROR: auto variable must be initialized in place of definition";
    goto LAB_001d7d12;
  }
  type = (TypeFunction *)initializer->type;
  if (type == (TypeFunction *)ctx->typeVoid) {
    pcVar7 = "ERROR: r-value type is \'void\'";
    goto LAB_001d7d12;
  }
  if (((type != (TypeFunction *)0x0) && ((type->super_TypeBase).typeID == 0x15)) &&
     (GetFunctionForType(&bestOverload,ctx,initializer->source,initializer,type),
     bestOverload.function != (FunctionData *)0x0)) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    initializer = (ExprBase *)CONCAT44(extraout_var,iVar3);
    ExprFunctionAccess::ExprFunctionAccess
              ((ExprFunctionAccess *)initializer,bestOverload.source,
               &(bestOverload.function)->type->super_TypeBase,bestOverload.function,
               bestOverload.context);
  }
  iVar3 = *(int *)&((FunctionData *)initializer)->importModule;
  this = (FunctionData *)initializer;
  if (iVar3 == 0x27) {
    uVar4 = IntrusiveList<FunctionHandle>::size
                      ((IntrusiveList<FunctionHandle> *)&((FunctionData *)initializer)->contextType)
    ;
    if (uVar4 != 1) {
      memset(&bestOverload.context,0,0x300);
      bestOverload.function = (FunctionData *)0x2000000000;
      bestOverload.source = (SynBase *)&bestOverload.context;
      GetNodeFunctions(ctx,*(SynBase **)&((FunctionData *)initializer)->isInternal,initializer,
                       (SmallArray<FunctionValue,_32U> *)&bestOverload);
      pcVar7 = ctx->errorBuf;
      if ((pcVar7 != (char *)0x0) && (ctx->errorBufSize != 0)) {
        if (ctx->errorCount == 0) {
          ctx->errorPos = (source->pos).begin;
          ctx->errorBufLocation = pcVar7;
          dst = pcVar7;
        }
        else {
          dst = ctx->errorBufLocation;
        }
        NULLC::SafeSprintf(dst,(ulong)(ctx->errorBufSize + ((int)pcVar7 - (int)dst)),
                           "ERROR: ambiguity, there is more than one overloaded function available:\n"
                          );
        pcVar7 = ctx->errorBufLocation;
        sVar6 = strlen(pcVar7);
        pcVar7 = pcVar7 + sVar6;
        ctx->errorBufLocation = pcVar7;
        functions.count = bestOverload.function._0_4_;
        functions.data = (FunctionValue *)bestOverload.source;
        functions._12_4_ = uStack_344;
        ReportOnFunctionSelectError
                  (ctx,source,pcVar7,(*(int *)&ctx->errorBuf - (int)pcVar7) + ctx->errorBufSize,dst,
                   functions);
        pcVar7 = ctx->errorBufLocation;
        sVar6 = strlen(pcVar7);
        ctx->errorBufLocation = pcVar7 + sVar6;
      }
      if (ctx->errorHandlerActive == false) {
        __assert_fail("ctx.errorHandlerActive",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x20e0,
                      "ExprBase *ResolveInitializerValue(ExpressionContext &, SynBase *, ExprBase *)"
                     );
      }
      longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
    }
    function = (FunctionData *)((FunctionData *)initializer)->contextType->_vptr_TypeBase;
    if (function->type->returnType == ctx->typeAuto) {
      pcVar7 = "ERROR: function type is unresolved at this point";
      goto LAB_001d7d12;
    }
    bVar2 = IsVirtualFunctionCall
                      (ctx,function,
                       *(TypeBase **)(*(long *)&((FunctionData *)initializer)->nameHash + 0x18));
    if (!bVar2) {
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      this = (FunctionData *)CONCAT44(extraout_var_01,iVar3);
      ExprFunctionAccess::ExprFunctionAccess
                ((ExprFunctionAccess *)this,*(SynBase **)&((FunctionData *)initializer)->isInternal,
                 &function->type->super_TypeBase,function,
                 *(ExprBase **)&((FunctionData *)initializer)->nameHash);
      iVar3 = *(int *)&this->importModule;
      goto LAB_001d7cf7;
    }
    arg1 = GetFunctionTable(ctx,source,function);
    name.end = "";
    name.begin = "__redirect_ptr";
    this = (FunctionData *)
           CreateFunctionCall2(ctx,source,name,
                               *(ExprBase **)&((FunctionData *)initializer)->nameHash,arg1,false,
                               true,true);
    if ((this == (FunctionData *)0x0) || (*(int *)&this->importModule != 0)) {
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pFVar5 = (FunctionData *)CONCAT44(extraout_var_00,iVar3);
      pSVar1 = (ScopeData *)function->type;
      *(uint *)&pFVar5->importModule = 0x12;
      *(SynBase **)&pFVar5->isInternal = source;
      pFVar5->scope = pSVar1;
      *(ExprBase **)&pFVar5->coroutine = (ExprBase *)0x0;
      *(bool *)&pFVar5->type = false;
      ((ExprBase *)&pFVar5->source)->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
      pFVar5->contextType = (TypeBase *)this;
      *(undefined4 *)&pFVar5->name = 0xd;
      iVar3 = 0x12;
      this = pFVar5;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
LAB_001d7cf7:
    if (iVar3 == 0x25) goto LAB_001d7d60;
  }
  if (*(bool *)((long)&this->scope->startOffset + 4) != true) {
    if (iVar3 != 0x17) {
      return (ExprBase *)this;
    }
    pcVar7 = "ERROR: target type of an \'auto ref\' cast is unknown";
LAB_001d7d12:
    anon_unknown.dwarf_ff84f::Report(ctx,source,pcVar7);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    type_00 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError((ExprError *)CONCAT44(extraout_var_02,iVar3),source,type_00);
    return &((ExprError *)CONCAT44(extraout_var_02,iVar3))->super_ExprBase;
  }
LAB_001d7d60:
  anon_unknown.dwarf_ff84f::Stop
            (ctx,source,
             "ERROR: cannot instantiate generic function, because target type is not known");
}

Assistant:

ExprBase* ResolveInitializerValue(ExpressionContext &ctx, SynBase *source, ExprBase *initializer)
{
	if(!initializer)
	{
		Report(ctx, source, "ERROR: auto variable must be initialized in place of definition");

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	if(initializer->type == ctx.typeVoid)
	{
		Report(ctx, source, "ERROR: r-value type is 'void'");

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	if(TypeFunction *target = getType<TypeFunction>(initializer->type))
	{
		if(FunctionValue bestOverload = GetFunctionForType(ctx, initializer->source, initializer, target))
			initializer = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, bestOverload.function->type, bestOverload.function, bestOverload.context);
	}

	if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(initializer))
	{
		if(node->functions.size() == 1)
		{
			FunctionData *function = node->functions.head->function;

			if(function->type->returnType == ctx.typeAuto)
			{
				Report(ctx, source, "ERROR: function type is unresolved at this point");

				return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
			}

			if(IsVirtualFunctionCall(ctx, function, node->context->type))
			{
				ExprBase *table = GetFunctionTable(ctx, source, function);

				initializer = CreateFunctionCall2(ctx, source, InplaceStr("__redirect_ptr"), node->context, table, false, true, true);

				if(!isType<TypeError>(initializer))
					initializer = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, function->type, initializer, EXPR_CAST_REINTERPRET);
			}
			else
			{
				initializer = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(initializer->source, function->type, function, node->context);
			}
		}
		else
		{
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, initializer->source, initializer, functions);

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: ambiguity, there is more than one overloaded function available:\n");

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, functions);

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);
			}

			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}
	}

	if(isType<ExprGenericFunctionPrototype>(initializer) || initializer->type->isGeneric)
		Stop(ctx, source, "ERROR: cannot instantiate generic function, because target type is not known");

	if(isType<ExprUnboxing>(initializer))
	{
		Report(ctx, source, "ERROR: target type of an 'auto ref' cast is unknown");

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	return initializer;
}